

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O0

void test_find(CuTest *tc)

{
  selist *psVar1;
  _Bool _Var2;
  int local_24;
  selist *psStack_20;
  int i;
  selist *il;
  selist *ql;
  CuTest *tc_local;
  
  il = (selist *)0x0;
  ql = (selist *)tc;
  selist_push(&il,lipsum);
  selist_push(&il,lipsum + 1);
  selist_push(&il,lipsum);
  psVar1 = ql;
  psStack_20 = il;
  local_24 = 0;
  _Var2 = selist_find(&stack0xffffffffffffffe0,&local_24,lipsum,(_func_int_void_ptr_void_ptr *)0x0);
  CuAssert_Line((CuTest *)psVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x62,"assert failed",(uint)_Var2);
  CuAssertIntEquals_LineMsg
            ((CuTest *)ql,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             99,(char *)0x0,0,local_24);
  selist_advance(&stack0xffffffffffffffe0,&local_24,1);
  psVar1 = ql;
  _Var2 = selist_find(&stack0xffffffffffffffe0,&local_24,lipsum,(_func_int_void_ptr_void_ptr *)0x0);
  CuAssert_Line((CuTest *)psVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x66,"assert failed",(uint)_Var2);
  CuAssertIntEquals_LineMsg
            ((CuTest *)ql,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x67,(char *)0x0,2,local_24);
  selist_advance(&stack0xffffffffffffffe0,&local_24,1);
  psVar1 = ql;
  _Var2 = selist_find(&stack0xffffffffffffffe0,&local_24,lipsum,(_func_int_void_ptr_void_ptr *)0x0);
  CuAssert_Line((CuTest *)psVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x6a,"assert failed",(uint)((_Var2 ^ 0xffU) & 1));
  selist_free(il);
  return;
}

Assistant:

static void test_find(CuTest *tc) {
    struct selist *ql = NULL;
    struct selist *il;
    int i;

    selist_push(&ql, (void *)lipsum);
    selist_push(&ql, (void *)(lipsum + 1));
    selist_push(&ql, (void *)lipsum);

    il = ql; i = 0;
    CuAssertTrue(tc, selist_find(&il, &i, (void *)lipsum, 0));
    CuAssertIntEquals(tc, 0, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, selist_find(&il, &i, (void *)lipsum, 0));
    CuAssertIntEquals(tc, 2, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, !selist_find(&il, &i, (void *)lipsum, 0));
    selist_free(ql);
}